

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O1

void ImGui::TableGcCompactTransientBuffers(ImGuiTable *table)

{
  ImGuiTableColumnSortSpecs *ptr;
  char *ptr_00;
  ImGuiContext *pIVar1;
  uint uVar2;
  long lVar3;
  ImGuiTableColumn *pIVar4;
  
  pIVar1 = GImGui;
  if (table->MemoryCompacted != false) {
    __assert_fail("table->MemoryCompacted == false",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O1/_deps/imgui-src/imgui_tables.cpp"
                  ,0xd99,"void ImGui::TableGcCompactTransientBuffers(ImGuiTable *)");
  }
  (table->SortSpecs).Specs = (ImGuiTableColumnSortSpecs *)0x0;
  ptr = (table->SortSpecsMulti).Data;
  if (ptr != (ImGuiTableColumnSortSpecs *)0x0) {
    (table->SortSpecsMulti).Size = 0;
    (table->SortSpecsMulti).Capacity = 0;
    MemFree(ptr);
    (table->SortSpecsMulti).Data = (ImGuiTableColumnSortSpecs *)0x0;
  }
  table->IsSortSpecsDirty = true;
  ptr_00 = (table->ColumnsNames).Buf.Data;
  if (ptr_00 != (char *)0x0) {
    (table->ColumnsNames).Buf.Size = 0;
    (table->ColumnsNames).Buf.Capacity = 0;
    MemFree(ptr_00);
    (table->ColumnsNames).Buf.Data = (char *)0x0;
  }
  table->MemoryCompacted = true;
  lVar3 = (long)table->ColumnsCount;
  if (0 < lVar3) {
    pIVar4 = (table->Columns).Data;
    do {
      if ((table->Columns).DataEnd <= pIVar4) {
        __assert_fail("p >= Data && p < DataEnd",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O1/_deps/imgui-src/imgui_internal.h"
                      ,0x255,"T &ImSpan<ImGuiTableColumn>::operator[](int) [T = ImGuiTableColumn]");
      }
      pIVar4->NameOffset = -1;
      pIVar4 = pIVar4 + 1;
      lVar3 = lVar3 + -1;
    } while (lVar3 != 0);
  }
  uVar2 = ImPool<ImGuiTable>::GetIndex(&pIVar1->Tables,table);
  if ((-1 < (int)uVar2) && ((int)uVar2 < (pIVar1->TablesLastTimeActive).Size)) {
    (pIVar1->TablesLastTimeActive).Data[uVar2] = -1.0;
    return;
  }
  __assert_fail("i >= 0 && i < Size",
                "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O1/_deps/imgui-src/imgui.h"
                ,0x703,"T &ImVector<float>::operator[](int) [T = float]");
}

Assistant:

void ImGui::TableGcCompactTransientBuffers(ImGuiTable* table)
{
    //IMGUI_DEBUG_PRINT("TableGcCompactTransientBuffers() id=0x%08X\n", table->ID);
    ImGuiContext& g = *GImGui;
    IM_ASSERT(table->MemoryCompacted == false);
    table->SortSpecs.Specs = NULL;
    table->SortSpecsMulti.clear();
    table->IsSortSpecsDirty = true; // FIXME: shouldn't have to leak into user performing a sort
    table->ColumnsNames.clear();
    table->MemoryCompacted = true;
    for (int n = 0; n < table->ColumnsCount; n++)
        table->Columns[n].NameOffset = -1;
    g.TablesLastTimeActive[g.Tables.GetIndex(table)] = -1.0f;
}